

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-chat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __end;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __beg;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  _func_void_ggml_log_level_char_ptr_void_ptr *p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  char *pcVar14;
  llama_chat_message *plVar15;
  size_type sVar16;
  size_type sVar17;
  reference plVar18;
  long lVar19;
  long in_RSI;
  int in_EDI;
  llama_chat_message *msg;
  iterator __end1;
  iterator __begin1;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> *__range1;
  string response;
  string prompt;
  int new_len;
  char *tmpl;
  string user;
  int prev_len;
  vector<char,_std::allocator<char>_> formatted;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> messages;
  anon_class_24_3_160fa8c9 generate;
  llama_sampler *smpl;
  llama_context *ctx;
  llama_context_params ctx_params;
  llama_vocab *vocab;
  llama_model *model;
  llama_model_params model_params;
  exception *e;
  int i;
  int n_ctx;
  int ngl;
  string model_path;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  int iVar20;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 uVar21;
  int in_stack_fffffffffffffaa4;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 uVar33;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 uVar34;
  char *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  __normal_iterator<llama_chat_message_*,_std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>_>
  local_370;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> *local_368;
  char *local_360;
  char *local_358;
  string local_350 [39];
  allocator<char> local_329;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  string local_308 [36];
  int local_2e4;
  char *local_2e0;
  char *local_2d8;
  undefined8 local_2d0;
  string local_2c8 [32];
  int local_2a8;
  allocator<char> local_2a1;
  vector<char,_std::allocator<char>_> local_2a0;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> local_288;
  long *local_270;
  undefined8 *local_268;
  string *prompt_00;
  undefined7 in_stack_fffffffffffffda8;
  string local_250;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  long local_1d0;
  int local_1c8;
  int iStack_1c4;
  size_type sStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined4 uStack_e4;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  __0 local_a9 [16];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [32];
  uint local_50;
  int local_3c;
  int local_38;
  int local_34;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_30);
  local_34 = 99;
  local_38 = 0x800;
  local_3c = 1;
  do {
    if (local_8 <= local_3c) {
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        p_Var11 = main::$_0::operator_cast_to_function_pointer(local_a9);
        llama_log_set(p_Var11,0);
        ggml_backend_load_all();
        llama_model_default_params(&local_f8);
        local_e8 = local_34;
        uVar12 = std::__cxx11::string::c_str();
        local_108 = local_b8;
        local_138 = CONCAT44(uStack_e4,local_e8);
        local_118 = local_c8;
        uStack_110 = uStack_c0;
        local_128 = local_d8;
        uStack_120 = uStack_d0;
        uStack_130 = uStack_e0;
        local_148 = local_f8;
        uStack_140 = uStack_f0;
        local_100 = llama_model_load_from_file(uVar12);
        if (local_100 == 0) {
          fprintf(_stderr,"%s: error: unable to load model\n","main");
          local_4 = 1;
          local_50 = 1;
        }
        else {
          local_150 = llama_model_get_vocab(local_100);
          llama_context_default_params(&local_1c8);
          local_1c8 = local_38;
          iStack_1c4 = local_38;
          local_1d8 = local_158;
          local_1e8 = local_168;
          uStack_1e0 = uStack_160;
          local_1f8 = local_178;
          uStack_1f0 = uStack_170;
          local_208 = local_188;
          uStack_200 = uStack_180;
          local_250._M_string_length = CONCAT44(local_38,local_38);
          local_218 = local_198;
          uVar4 = local_218;
          uStack_210 = uStack_190;
          uVar5 = uStack_210;
          local_228 = local_1a8;
          uVar2 = local_228;
          uStack_220 = uStack_1a0;
          uVar3 = uStack_220;
          local_250.field_2._8_8_ = local_1b8;
          uVar13 = local_250.field_2._8_8_;
          uStack_230 = uStack_1b0;
          uVar1 = uStack_230;
          local_250.field_2._M_allocated_capacity = sStack_1c0;
          uVar12 = local_250.field_2._M_allocated_capacity;
          local_250.field_2._M_allocated_capacity._0_4_ = (undefined4)sStack_1c0;
          local_250.field_2._M_allocated_capacity._4_4_ = (undefined4)(sStack_1c0 >> 0x20);
          local_250.field_2._8_4_ = (undefined4)local_1b8;
          local_250.field_2._12_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
          uStack_230._0_4_ = (undefined4)uStack_1b0;
          uStack_230._4_4_ = (undefined4)((ulong)uStack_1b0 >> 0x20);
          local_228._0_4_ = (undefined4)local_1a8;
          local_228._4_4_ = (undefined4)((ulong)local_1a8 >> 0x20);
          uStack_220._0_4_ = (undefined4)uStack_1a0;
          uStack_220._4_4_ = (undefined4)((ulong)uStack_1a0 >> 0x20);
          local_218._0_4_ = (undefined4)local_198;
          local_218._4_4_ = (undefined4)((ulong)local_198 >> 0x20);
          uStack_210._0_4_ = (undefined4)uStack_190;
          uStack_210._4_4_ = (undefined4)((ulong)uStack_190 >> 0x20);
          iVar8 = local_38;
          iVar20 = local_38;
          uVar21 = local_250.field_2._M_allocated_capacity._0_4_;
          uVar22 = local_250.field_2._M_allocated_capacity._4_4_;
          uVar23 = local_250.field_2._8_4_;
          uVar24 = local_250.field_2._12_4_;
          uVar25 = (undefined4)uStack_230;
          uVar26 = uStack_230._4_4_;
          uVar27 = (undefined4)local_228;
          uVar28 = local_228._4_4_;
          uVar29 = (undefined4)uStack_220;
          uVar30 = uStack_220._4_4_;
          uVar31 = (undefined4)local_218;
          uVar32 = local_218._4_4_;
          uVar33 = (undefined4)uStack_210;
          uVar34 = uStack_210._4_4_;
          local_250.field_2._M_allocated_capacity = uVar12;
          local_250.field_2._8_8_ = uVar13;
          uStack_230 = uVar1;
          local_228 = uVar2;
          uStack_220 = uVar3;
          local_218 = uVar4;
          uStack_210 = uVar5;
          local_1d0 = llama_init_from_model(local_100);
          if (local_1d0 == 0) {
            fprintf(_stderr,"%s: error: failed to create the llama_context\n","main");
            local_4 = 1;
            local_50 = 1;
          }
          else {
            uVar6 = llama_sampler_chain_default_params();
            uVar12 = llama_sampler_chain_init(uVar6);
            local_250._0_8_ = uVar12;
            uVar13 = llama_sampler_init_min_p(0x3d4ccccd,1);
            llama_sampler_chain_add(uVar12,uVar13);
            uVar12 = local_250._0_8_;
            uVar13 = llama_sampler_init_temp(0x3f4ccccd);
            llama_sampler_chain_add(uVar12,uVar13);
            uVar12 = local_250._0_8_;
            uVar13 = llama_sampler_init_dist(0xffffffff);
            llama_sampler_chain_add(uVar12,uVar13);
            local_270 = &local_1d0;
            local_268 = &local_150;
            prompt_00 = &local_250;
            std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::vector
                      ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)0x105fb3);
            llama_n_ctx(local_1d0);
            std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)CONCAT44(uVar30,uVar29),
                       CONCAT44(uVar28,uVar27),(allocator_type *)CONCAT44(uVar26,uVar25));
            std::allocator<char>::~allocator(&local_2a1);
            local_2a8 = 0;
            do {
              printf("\x1b[32m> \x1b[0m");
              std::__cxx11::string::string(local_2c8);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,local_2c8);
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                local_2d0 = llama_model_chat_template(local_100,0);
                local_2e0 = "user";
                pcVar14 = (char *)std::__cxx11::string::c_str();
                local_2d8 = strdup(pcVar14);
                std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::push_back
                          ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                           CONCAT44(uVar22,uVar21),(value_type *)CONCAT44(iVar20,iVar8));
                uVar12 = local_2d0;
                plVar15 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::data
                                    ((vector<llama_chat_message,_std::allocator<llama_chat_message>_>
                                      *)0x10618d);
                sVar16 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::size
                                   (&local_288);
                pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)0x1061bf);
                sVar17 = std::vector<char,_std::allocator<char>_>::size(&local_2a0);
                iVar9 = llama_chat_apply_template
                                  (uVar12,plVar15,sVar16,1,pcVar14,sVar17 & 0xffffffff);
                local_2e4 = iVar9;
                sVar16 = std::vector<char,_std::allocator<char>_>::size(&local_2a0);
                if ((int)sVar16 < iVar9) {
                  std::vector<char,_std::allocator<char>_>::resize
                            ((vector<char,_std::allocator<char>_> *)CONCAT44(uVar30,uVar29),
                             CONCAT44(uVar28,uVar27));
                  uVar12 = local_2d0;
                  plVar15 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                            data((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                                 0x106281);
                  sVar16 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                           size(&local_288);
                  pcVar14 = std::vector<char,_std::allocator<char>_>::data
                                      ((vector<char,_std::allocator<char>_> *)0x1062b3);
                  sVar17 = std::vector<char,_std::allocator<char>_>::size(&local_2a0);
                  local_2e4 = llama_chat_apply_template
                                        (uVar12,plVar15,sVar16,1,pcVar14,sVar17 & 0xffffffff);
                }
                if (local_2e4 < 0) {
                  fprintf(_stderr,"failed to apply the chat template\n");
                  local_4 = 1;
                  local_50 = 1;
                }
                else {
                  local_318 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                                ((vector<char,_std::allocator<char>_> *)
                                                 CONCAT44(iVar20,iVar8));
                  local_310 = (char *)__gnu_cxx::
                                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      ::operator+((
                                                  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                                  *)CONCAT44(uVar24,uVar23),CONCAT44(uVar22,uVar21))
                  ;
                  local_328 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                                ((vector<char,_std::allocator<char>_> *)
                                                 CONCAT44(iVar20,iVar8));
                  local_320 = (char *)__gnu_cxx::
                                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      ::operator+((
                                                  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                                  *)CONCAT44(uVar24,uVar23),CONCAT44(uVar22,uVar21))
                  ;
                  std::allocator<char>::allocator();
                  __beg._M_current._4_4_ = uVar34;
                  __beg._M_current._0_4_ = uVar33;
                  __end._M_current._4_4_ = uVar32;
                  __end._M_current._0_4_ = uVar31;
                  std::__cxx11::string::
                  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(uVar30,uVar29),__beg,__end,
                             (allocator<char> *)CONCAT44(uVar28,uVar27));
                  std::allocator<char>::~allocator(&local_329);
                  printf("\x1b[33m");
                  main::anon_class_24_3_160fa8c9::operator()
                            ((anon_class_24_3_160fa8c9 *)CONCAT17(uVar6,in_stack_fffffffffffffda8),
                             prompt_00);
                  printf("\n\x1b[0m");
                  local_360 = "assistant";
                  pcVar14 = (char *)std::__cxx11::string::c_str();
                  local_358 = strdup(pcVar14);
                  std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::push_back
                            ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                             CONCAT44(uVar22,uVar21),(value_type *)CONCAT44(iVar20,iVar8));
                  uVar12 = local_2d0;
                  plVar15 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                            data((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                                 0x1064a5);
                  sVar16 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
                           size(&local_288);
                  local_2a8 = llama_chat_apply_template(uVar12,plVar15,sVar16,0,0);
                  bVar7 = local_2a8 < 0;
                  if (bVar7) {
                    fprintf(_stderr,"failed to apply the chat template\n");
                    local_4 = 1;
                  }
                  local_50 = (uint)bVar7;
                  std::__cxx11::string::~string(local_350);
                  std::__cxx11::string::~string(local_308);
                }
              }
              else {
                local_50 = 6;
              }
              std::__cxx11::string::~string(local_2c8);
            } while (local_50 == 0);
            if (local_50 == 6) {
              local_368 = &local_288;
              local_370._M_current =
                   (llama_chat_message *)
                   std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::begin
                             ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                              CONCAT44(iVar20,iVar8));
              std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::end
                        ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                         CONCAT44(iVar20,iVar8));
              while (bVar7 = __gnu_cxx::operator!=
                                       ((__normal_iterator<llama_chat_message_*,_std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>_>
                                         *)CONCAT44(uVar22,uVar21),
                                        (__normal_iterator<llama_chat_message_*,_std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>_>
                                         *)CONCAT44(iVar20,iVar8)), bVar7) {
                plVar18 = __gnu_cxx::
                          __normal_iterator<llama_chat_message_*,_std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>_>
                          ::operator*(&local_370);
                free(plVar18->content);
                __gnu_cxx::
                __normal_iterator<llama_chat_message_*,_std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>_>
                ::operator++(&local_370);
              }
              llama_sampler_free(local_250._0_8_);
              llama_free(local_1d0);
              llama_model_free(local_100);
              local_4 = 0;
              local_50 = 1;
            }
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)CONCAT44(uVar26,uVar25));
            std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::~vector
                      ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
                       CONCAT44(uVar26,uVar25));
          }
        }
      }
      else {
        print_usage(in_stack_fffffffffffffaa4,
                    (char **)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        local_4 = 1;
        local_50 = 1;
      }
LAB_0010670f:
      std::__cxx11::string::~string(local_30);
      return local_4;
    }
    iVar8 = strcmp(*(char **)(local_10 + (long)local_3c * 8),"-m");
    if (iVar8 == 0) {
      if (local_8 <= local_3c + 1) {
        print_usage(in_stack_fffffffffffffaa4,
                    (char **)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        local_4 = 1;
        local_50 = 1;
        goto LAB_0010670f;
      }
      lVar19 = (long)local_3c;
      local_3c = local_3c + 1;
      std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8 + lVar19 * 8));
    }
    else {
      iVar8 = strcmp(*(char **)(local_10 + (long)local_3c * 8),"-c");
      if (iVar8 == 0) {
        if (local_8 <= local_3c + 1) {
          print_usage(in_stack_fffffffffffffaa4,
                      (char **)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          local_4 = 1;
          local_50 = 1;
          goto LAB_0010670f;
        }
        local_3c = local_3c + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0))
        ;
        local_38 = std::__cxx11::stoi((string *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                                      0);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator(&local_71);
      }
      else {
        iVar8 = strcmp(*(char **)(local_10 + (long)local_3c * 8),"-ngl");
        if (iVar8 != 0) {
          print_usage(in_stack_fffffffffffffaa4,
                      (char **)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          local_4 = 1;
          local_50 = 1;
          goto LAB_0010670f;
        }
        if (local_8 <= local_3c + 1) {
          print_usage(in_stack_fffffffffffffaa4,
                      (char **)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          local_4 = 1;
          local_50 = 1;
          goto LAB_0010670f;
        }
        local_3c = local_3c + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0))
        ;
        local_34 = std::__cxx11::stoi((string *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                                      0);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator(&local_99);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    std::string model_path;
    int ngl = 99;
    int n_ctx = 2048;

    // parse command line arguments
    for (int i = 1; i < argc; i++) {
        try {
            if (strcmp(argv[i], "-m") == 0) {
                if (i + 1 < argc) {
                    model_path = argv[++i];
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-c") == 0) {
                if (i + 1 < argc) {
                    n_ctx = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else if (strcmp(argv[i], "-ngl") == 0) {
                if (i + 1 < argc) {
                    ngl = std::stoi(argv[++i]);
                } else {
                    print_usage(argc, argv);
                    return 1;
                }
            } else {
                print_usage(argc, argv);
                return 1;
            }
        } catch (std::exception & e) {
            fprintf(stderr, "error: %s\n", e.what());
            print_usage(argc, argv);
            return 1;
        }
    }
    if (model_path.empty()) {
        print_usage(argc, argv);
        return 1;
    }

    // only print errors
    llama_log_set([](enum ggml_log_level level, const char * text, void * /* user_data */) {
        if (level >= GGML_LOG_LEVEL_ERROR) {
            fprintf(stderr, "%s", text);
        }
    }, nullptr);

    // load dynamic backends
    ggml_backend_load_all();

    // initialize the model
    llama_model_params model_params = llama_model_default_params();
    model_params.n_gpu_layers = ngl;

    llama_model * model = llama_model_load_from_file(model_path.c_str(), model_params);
    if (!model) {
        fprintf(stderr , "%s: error: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context
    llama_context_params ctx_params = llama_context_default_params();
    ctx_params.n_ctx = n_ctx;
    ctx_params.n_batch = n_ctx;

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr , "%s: error: failed to create the llama_context\n" , __func__);
        return 1;
    }

    // initialize the sampler
    llama_sampler * smpl = llama_sampler_chain_init(llama_sampler_chain_default_params());
    llama_sampler_chain_add(smpl, llama_sampler_init_min_p(0.05f, 1));
    llama_sampler_chain_add(smpl, llama_sampler_init_temp(0.8f));
    llama_sampler_chain_add(smpl, llama_sampler_init_dist(LLAMA_DEFAULT_SEED));

    // helper function to evaluate a prompt and generate a response
    auto generate = [&](const std::string & prompt) {
        std::string response;

        const bool is_first = llama_kv_self_used_cells(ctx) == 0;

        // tokenize the prompt
        const int n_prompt_tokens = -llama_tokenize(vocab, prompt.c_str(), prompt.size(), NULL, 0, is_first, true);
        std::vector<llama_token> prompt_tokens(n_prompt_tokens);
        if (llama_tokenize(vocab, prompt.c_str(), prompt.size(), prompt_tokens.data(), prompt_tokens.size(), is_first, true) < 0) {
            GGML_ABORT("failed to tokenize the prompt\n");
        }

        // prepare a batch for the prompt
        llama_batch batch = llama_batch_get_one(prompt_tokens.data(), prompt_tokens.size());
        llama_token new_token_id;
        while (true) {
            // check if we have enough space in the context to evaluate this batch
            int n_ctx = llama_n_ctx(ctx);
            int n_ctx_used = llama_kv_self_used_cells(ctx);
            if (n_ctx_used + batch.n_tokens > n_ctx) {
                printf("\033[0m\n");
                fprintf(stderr, "context size exceeded\n");
                exit(0);
            }

            if (llama_decode(ctx, batch)) {
                GGML_ABORT("failed to decode\n");
            }

            // sample the next token
            new_token_id = llama_sampler_sample(smpl, ctx, -1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id)) {
                break;
            }

            // convert the token to a string, print it and add it to the response
            char buf[256];
            int n = llama_token_to_piece(vocab, new_token_id, buf, sizeof(buf), 0, true);
            if (n < 0) {
                GGML_ABORT("failed to convert token to piece\n");
            }
            std::string piece(buf, n);
            printf("%s", piece.c_str());
            fflush(stdout);
            response += piece;

            // prepare the next batch with the sampled token
            batch = llama_batch_get_one(&new_token_id, 1);
        }

        return response;
    };

    std::vector<llama_chat_message> messages;
    std::vector<char> formatted(llama_n_ctx(ctx));
    int prev_len = 0;
    while (true) {
        // get user input
        printf("\033[32m> \033[0m");
        std::string user;
        std::getline(std::cin, user);

        if (user.empty()) {
            break;
        }

        const char * tmpl = llama_model_chat_template(model, /* name */ nullptr);

        // add the user input to the message list and format it
        messages.push_back({"user", strdup(user.c_str())});
        int new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        if (new_len > (int)formatted.size()) {
            formatted.resize(new_len);
            new_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), true, formatted.data(), formatted.size());
        }
        if (new_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }

        // remove previous messages to obtain the prompt to generate the response
        std::string prompt(formatted.begin() + prev_len, formatted.begin() + new_len);

        // generate a response
        printf("\033[33m");
        std::string response = generate(prompt);
        printf("\n\033[0m");

        // add the response to the messages
        messages.push_back({"assistant", strdup(response.c_str())});
        prev_len = llama_chat_apply_template(tmpl, messages.data(), messages.size(), false, nullptr, 0);
        if (prev_len < 0) {
            fprintf(stderr, "failed to apply the chat template\n");
            return 1;
        }
    }

    // free resources
    for (auto & msg : messages) {
        free(const_cast<char *>(msg.content));
    }
    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}